

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O3

uint64_t SharpYUVUpdateY_C(uint16_t *ref,uint16_t *src,uint16_t *dst,int len)

{
  uint64_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint16_t uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  if (0 < len) {
    uVar6 = 0;
    uVar1 = 0;
    do {
      iVar7 = (uint)ref[uVar6] - (uint)src[uVar6];
      uVar3 = (uint)dst[uVar6] + iVar7;
      uVar5 = 0x3ff;
      if (uVar3 < 0x3ff) {
        uVar5 = uVar3;
      }
      uVar4 = (uint16_t)uVar5;
      if ((int)uVar3 < 0) {
        uVar4 = 0;
      }
      dst[uVar6] = uVar4;
      uVar2 = -(ushort)iVar7;
      if (0 < iVar7) {
        uVar2 = (ushort)iVar7;
      }
      uVar1 = uVar1 + uVar2;
      uVar6 = uVar6 + 1;
    } while ((uint)len != uVar6);
    return uVar1;
  }
  return 0;
}

Assistant:

static uint64_t SharpYUVUpdateY_C(const uint16_t* ref, const uint16_t* src,
                                  uint16_t* dst, int len) {
  uint64_t diff = 0;
  int i;
  for (i = 0; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_y(new_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}